

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

void __thiscall flow::BasicBlock::merge_back(BasicBlock *this,BasicBlock *bb)

{
  bool bVar1;
  TerminateInstr *pTVar2;
  reference this_00;
  pointer pIVar3;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *this_01;
  reference ppVVar4;
  reference ppBVar5;
  IRHandler *this_02;
  BasicBlock *local_a8;
  long local_98;
  BasicBlock *succ_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *__range1_1;
  BasicBlock *succ;
  Value *operand;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *__range3;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *instr;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  *__range1;
  BasicBlock *bb_local;
  BasicBlock *this_local;
  
  pTVar2 = getTerminator(this);
  if (pTVar2 != (TerminateInstr *)0x0) {
    __assert_fail("getTerminator() == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x89,"void flow::BasicBlock::merge_back(BasicBlock *)");
  }
  __end1 = std::
           vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
           ::begin(&bb->code_);
  instr = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
          std::
          vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
          ::end(&bb->code_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                                     *)&instr), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
              ::operator*(&__end1);
    pIVar3 = std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::operator->(this_00);
    Instr::setParent(pIVar3,this);
    pIVar3 = std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::get(this_00);
    if (pIVar3 == (pointer)0x0) {
      local_98 = 0;
    }
    else {
      local_98 = __dynamic_cast(pIVar3,&Instr::typeinfo,&TerminateInstr::typeinfo,0);
    }
    if (local_98 != 0) {
      pIVar3 = std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::operator->(this_00);
      this_01 = Instr::operands(pIVar3);
      __end3 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::begin(this_01);
      operand = (Value *)std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<flow::Value_*const_*,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
                                         *)&operand), bVar1) {
        ppVVar4 = __gnu_cxx::
                  __normal_iterator<flow::Value_*const_*,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
                  ::operator*(&__end3);
        if (*ppVVar4 == (Value *)0x0) {
          local_a8 = (BasicBlock *)0x0;
        }
        else {
          local_a8 = (BasicBlock *)__dynamic_cast(*ppVVar4,&Value::typeinfo,&typeinfo,0);
        }
        if (local_a8 != (BasicBlock *)0x0) {
          unlinkSuccessor(bb,local_a8);
          linkSuccessor(this,local_a8);
        }
        __gnu_cxx::
        __normal_iterator<flow::Value_*const_*,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
        ::operator++(&__end3);
      }
    }
    std::
    vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
    ::push_back(&this->code_,this_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  ::clear(&bb->code_);
  __end1_1 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin
                       (&bb->successors_);
  succ_1 = (BasicBlock *)
           std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                     (&bb->successors_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
                             *)&succ_1), bVar1) {
    ppBVar5 = __gnu_cxx::
              __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
              ::operator*(&__end1_1);
    unlinkSuccessor(this,*ppBVar5);
    __gnu_cxx::
    __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
    ::operator++(&__end1_1);
  }
  this_02 = getHandler(bb);
  IRHandler::erase(this_02,bb);
  return;
}

Assistant:

void BasicBlock::merge_back(BasicBlock* bb) {
  assert(getTerminator() == nullptr);

#if 0
  for (const std::unique_ptr<Instr>& instr : bb->code_) {
    push_back(instr->clone());
  }
#else
  for (std::unique_ptr<Instr>& instr : bb->code_) {
    instr->setParent(this);
    if (dynamic_cast<TerminateInstr*>(instr.get())) {
      // then check for possible successors
      for (Value* operand : instr->operands()) {
        if (auto succ = dynamic_cast<BasicBlock*>(operand)) {
          bb->unlinkSuccessor(succ);
          linkSuccessor(succ);
        }
      }
    }
    code_.push_back(std::move(instr));
  }
  bb->code_.clear();
  for (BasicBlock* succ : bb->successors_) {
    unlinkSuccessor(succ);
  }
  bb->getHandler()->erase(bb);
#endif
}